

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnSubClampTranslatedPalCommand::Execute
          (DrawColumnSubClampTranslatedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int pitch_00;
  uchar *dest_00;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint32_t b;
  uint32_t a;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  uint8_t *source;
  uint8_t *colormap;
  uint8_t *translation;
  int pitch;
  fixed_t fracstep;
  fixed_t frac;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawColumnSubClampTranslatedPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  iVar1 = (this->super_PalColumnCommand)._iscale;
  iVar2 = (this->super_PalColumnCommand)._texturefrac;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    pitch_00 = (this->super_PalColumnCommand)._pitch;
    _fracstep = DrawerThread::dest_for_thread<unsigned_char>
                          (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                           pitch_00,dest_00);
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pitch = iVar1 * iVar8 + iVar2;
    iVar2 = thread->num_cores;
    iVar8 = thread->num_cores;
    puVar3 = (this->super_PalColumnCommand)._translation;
    puVar4 = (this->super_PalColumnCommand)._colormap;
    puVar5 = (this->super_PalColumnCommand)._source;
    puVar6 = (this->super_PalColumnCommand)._srcblend;
    puVar7 = (this->super_PalColumnCommand)._destblend;
    do {
      uVar9 = (puVar6[puVar4[puVar3[puVar5[pitch >> 0x10]]]] | 0x40100400) - puVar7[*_fracstep];
      uVar10 = uVar9 & 0x40100400;
      uVar9 = uVar10 - (uVar10 >> 5) & uVar9 | 0x1f07c1f;
      *_fracstep = RGB32k.All[uVar9 >> 0xf & uVar9];
      _fracstep = _fracstep + iVar8 * pitch_00;
      pitch = iVar2 * iVar1 + pitch;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawColumnSubClampTranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *translation = _translation;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		do
		{
			uint32_t a = (fg2rgb[colormap[translation[source[frac >> FRACBITS]]]] | 0x40100400) - bg2rgb[*dest];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[(a >> 15) & a];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}